

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OdiPublisher.cpp
# Opt level: O0

bool OdiPublisher::CopyFile(char *source_file_name,char *dest_file_name)

{
  int iVar1;
  FILE *__stream;
  uint *puVar2;
  size_t sVar3;
  size_t nb_read;
  FILE *F_in;
  FILE *F_out;
  char line [512];
  bool local_19;
  bool ret;
  char *dest_file_name_local;
  char *source_file_name_local;
  
  F_in = (FILE *)0x0;
  __stream = (FILE *)ithi_file_open(source_file_name,"r");
  if (__stream == (FILE *)0x0) {
    puVar2 = (uint *)__errno_location();
    printf("Could not read file %s, err: %d\n",source_file_name,(ulong)*puVar2);
    local_19 = false;
  }
  else {
    F_in = ithi_file_open(dest_file_name,"w");
    if (F_in == (FILE *)0x0) {
      puVar2 = (uint *)__errno_location();
      printf("Could not write file %s, err: %d\n",dest_file_name,(ulong)*puVar2);
    }
    local_19 = F_in != (FILE *)0x0;
  }
  do {
    if (local_19 == false) {
LAB_001ce5ba:
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      if (F_in != (FILE *)0x0) {
        fclose((FILE *)F_in);
      }
      return local_19;
    }
    sVar3 = fread(&F_out,1,0x200,__stream);
    if (sVar3 == 0) {
      iVar1 = feof(__stream);
      local_19 = iVar1 != 0;
      goto LAB_001ce5ba;
    }
    sVar3 = fwrite(&F_out,1,sVar3,(FILE *)F_in);
    local_19 = sVar3 != 0;
  } while( true );
}

Assistant:

bool OdiPublisher::CopyFile(const char * source_file_name, const char * dest_file_name)
{
    bool ret = true;
    char line[512];
    FILE * F_out = NULL;
    FILE* F_in = ithi_file_open(source_file_name, "r");

    if (F_in != NULL)
    {
        F_out = ithi_file_open(dest_file_name, "w");
        if (F_out == NULL) {
            printf("Could not write file %s, err: %d\n", dest_file_name, errno);
            ret = false;
        }
    }
    else {
        printf("Could not read file %s, err: %d\n", source_file_name, errno);
        ret = false;
    }

    while (ret) {
        size_t nb_read = fread(line, 1, sizeof(line), F_in);

        if (nb_read > 0) {
            ret = fwrite(line, 1, nb_read, F_out) > 0;
        }
        else {
            ret = feof(F_in) != 0;
            break;
        }
    }

    if (F_in != NULL) {
        fclose(F_in);
    }

    if (F_out != NULL) {
        fclose(F_out);
    }

    return ret;
}